

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_65694::CtorEvalExternalInterface::importGlobals
          (CtorEvalExternalInterface *this,GlobalValueSet *globals,Module *wasm_)

{
  GlobalValueSet *in_RCX;
  anon_class_16_2_d56293dd visitor;
  Module *wasm__local;
  GlobalValueSet *globals_local;
  CtorEvalExternalInterface *this_local;
  
  visitor.globals = in_RCX;
  visitor.this = (CtorEvalExternalInterface *)globals;
  ::wasm::ModuleUtils::
  iterImportedGlobals<(anonymous_namespace)::CtorEvalExternalInterface::importGlobals(std::map<wasm::Name,wasm::Literals,std::less<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Literals>>>&,wasm::Module&)::_lambda(wasm::Global*)_1_>
            ((ModuleUtils *)wasm_,(Module *)this,visitor);
  return;
}

Assistant:

void importGlobals(GlobalValueSet& globals, Module& wasm_) override {
    ModuleUtils::iterImportedGlobals(wasm_, [&](Global* global) {
      auto it = linkedInstances.find(global->module);
      if (it != linkedInstances.end()) {
        auto* inst = it->second.get();
        auto* globalExport = inst->wasm.getExportOrNull(global->base);
        if (!globalExport || globalExport->kind != ExternalKind::Global) {
          throw FailToEvalException(std::string("importGlobals: ") +
                                    global->module.toString() + "." +
                                    global->base.toString());
        }
        globals[global->name] = inst->globals[*globalExport->getInternalName()];
      } else {
        throw FailToEvalException(std::string("importGlobals: ") +
                                  global->module.toString() + "." +
                                  global->base.toString());
      }
    });
  }